

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instance.cc
# Opt level: O2

int __thiscall
aliyun::Drds::DescribeDrdsInstance
          (Drds *this,DrdsDescribeDrdsInstanceRequestType *req,
          DrdsDescribeDrdsInstanceResponseType *response,DrdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  allocator<char> local_380;
  allocator<char> local_37f;
  allocator<char> local_37e;
  allocator<char> local_37d;
  uint local_37c;
  Value val;
  undefined1 local_360 [32];
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string local_300;
  string str_response;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&local_300);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeDrdsInstance",(allocator<char> *)&local_300);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->drds_instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"DrdsInstanceId",(allocator<char> *)local_360);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"RegionId",(allocator<char> *)local_360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,this->region_id_,(allocator<char> *)&local_300);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_360,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_360,anon_var_dwarf_fb9f7 + 9,&local_37d);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_360);
        std::__cxx11::string::~string((string *)local_360);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_360,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_360,anon_var_dwarf_fb9f7 + 9,&local_37e);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_360);
        std::__cxx11::string::~string((string *)local_360);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_360,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_360,anon_var_dwarf_fb9f7 + 9,&local_37f);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_360);
        std::__cxx11::string::~string((string *)local_360);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_360,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_360,anon_var_dwarf_fb9f7 + 9,&local_380);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_360);
        std::__cxx11::string::~string((string *)local_360);
      }
      if (response != (DrdsDescribeDrdsInstanceResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Success");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Success");
          bVar1 = Json::Value::asBool(pVVar5);
          response->success = bVar1;
        }
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar5,"DrdsInstanceId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"DrdsInstanceId");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).drds_instance_id,(string *)local_360);
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"Type");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"Type");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=((string *)&(response->data).type,(string *)local_360);
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"RegionId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"RegionId");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).region_id,(string *)local_360);
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"ZoneId");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"ZoneId");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=((string *)&(response->data).zone_id,(string *)local_360)
            ;
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"Description");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"Description");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).description,(string *)local_360);
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"NetworkType");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"NetworkType");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).network_type,(string *)local_360);
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"Status");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"Status");
            Json::Value::asString_abi_cxx11_((string *)local_360,pVVar6);
            std::__cxx11::string::operator=((string *)&(response->data).status,(string *)local_360);
            std::__cxx11::string::~string((string *)local_360);
          }
          bVar1 = Json::Value::isMember(pVVar5,"CreateTime");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"CreateTime");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->data).create_time = (long)IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"Version");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"Version");
            IVar3 = Json::Value::asInt(pVVar6);
            (response->data).version = (long)IVar3;
          }
          bVar1 = Json::Value::isMember(pVVar5,"Vips");
          if (bVar1) {
            pVVar6 = Json::Value::operator[](pVVar5,"Vips");
            bVar1 = Json::Value::isMember(pVVar6,"Vip");
            if (bVar1) {
              pVVar5 = Json::Value::operator[](pVVar5,"Vips");
              pVVar5 = Json::Value::operator[](pVVar5,"Vip");
              bVar1 = Json::Value::isArray(pVVar5);
              if (bVar1) {
                local_37c = 0;
                while( true ) {
                  AVar4 = Json::Value::size(pVVar5);
                  if (AVar4 <= local_37c) break;
                  local_360._0_8_ = local_360 + 0x10;
                  local_360._8_8_ = 0;
                  local_360[0x10] = '\0';
                  local_340._M_p = (pointer)&local_330;
                  local_338 = 0;
                  local_330._M_local_buf[0] = '\0';
                  local_320._M_p = (pointer)&local_310;
                  local_318 = 0;
                  local_310._M_local_buf[0] = '\0';
                  pVVar6 = Json::Value::operator[](pVVar5,local_37c);
                  bVar1 = Json::Value::isMember(pVVar6,"IP");
                  if (bVar1) {
                    pVVar7 = Json::Value::operator[](pVVar6,"IP");
                    Json::Value::asString_abi_cxx11_(&local_300,pVVar7);
                    std::__cxx11::string::operator=((string *)local_360,(string *)&local_300);
                    std::__cxx11::string::~string((string *)&local_300);
                  }
                  bVar1 = Json::Value::isMember(pVVar6,"Port");
                  if (bVar1) {
                    pVVar7 = Json::Value::operator[](pVVar6,"Port");
                    Json::Value::asString_abi_cxx11_(&local_300,pVVar7);
                    std::__cxx11::string::operator=((string *)&local_340,(string *)&local_300);
                    std::__cxx11::string::~string((string *)&local_300);
                  }
                  bVar1 = Json::Value::isMember(pVVar6,"Type");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar6,"Type");
                    Json::Value::asString_abi_cxx11_(&local_300,pVVar6);
                    std::__cxx11::string::operator=((string *)&local_320,(string *)&local_300);
                    std::__cxx11::string::~string((string *)&local_300);
                  }
                  std::
                  vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
                  ::push_back((vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
                               *)response,(DrdsDescribeDrdsInstanceVipType *)local_360);
                  DrdsDescribeDrdsInstanceVipType::~DrdsDescribeDrdsInstanceVipType
                            ((DrdsDescribeDrdsInstanceVipType *)local_360);
                  local_37c = local_37c + 1;
                }
              }
            }
          }
        }
      }
      goto LAB_00132bc0;
    }
  }
  iVar2 = -1;
  if (error_info != (DrdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00132bc0:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Drds::DescribeDrdsInstance(const DrdsDescribeDrdsInstanceRequestType& req,
                      DrdsDescribeDrdsInstanceResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDrdsInstance");
  if(!req.drds_instance_id.empty()) {
    req_rpc->AddRequestQuery("DrdsInstanceId", req.drds_instance_id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}